

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O2

void __thiscall
ear::GainCalculatorDirectSpeakersImpl::calculate
          (GainCalculatorDirectSpeakersImpl *this,DirectSpeakersTypeMetadata *metadata,
          OutputGains *direct,WarningCB *warning_cb)

{
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *psVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool isLfe;
  bool bVar6;
  reference_const_type __k;
  const_iterator cVar7;
  reference_type piVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  Scalar *pSVar10;
  DenseStorage<double,__1,__1,_1,_0> *other;
  not_implemented *this_00;
  adm_error *this_01;
  long index_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  SpeakerPosition *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar11;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *channel_gain;
  string *name;
  string label;
  VectorXd gains;
  optional<int> index;
  optional_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_200;
  SpeakerPosition shiftedPosition;
  variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> local_100;
  
  if (((metadata->audioPackFormatID).super_type.m_initialized == true) &&
     ((metadata->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (metadata->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    this_01 = (adm_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shiftedPosition,
               "common definitions audioPackFormatID specified without any speakerLabels as specified in the common definitions file"
               ,(allocator<char> *)&label);
    adm_error::adm_error(this_01,(string *)&shiftedPosition);
    __cxa_throw(this_01,&adm_error::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (**direct->_vptr_OutputGains)(direct,(long)this->_nChannels);
  uVar1 = (metadata->position).which_;
  switch((int)uVar1 >> 0x1f ^ uVar1) {
  case 0:
    break;
  case 1:
    this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shiftedPosition,"Cartesian position",(allocator<char> *)&label);
    not_implemented::not_implemented(this_00,(string *)&shiftedPosition);
    __cxa_throw(this_00,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
  default:
    boost::detail::variant::forced_return<void>();
  }
  isLfe = _isLfeChannel(this,metadata,warning_cb);
  (*direct->_vptr_OutputGains[3])();
  if ((metadata->audioPackFormatID).super_type.m_initialized == true) {
    __k = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::get(&metadata->audioPackFormatID);
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)itu_packs_abi_cxx11_,__k);
    if (cVar7._M_node != (_Base_ptr)(itu_packs_abi_cxx11_ + 8)) {
      _nominalSpeakerLabel
                (&label,this,
                 (metadata->speakerLabels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pbVar5 = DAT_0021ac80;
      for (__rhs = rules; __rhs != pbVar5;
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &__rhs[3]._M_string_length) {
        if ((__rhs[2]._M_dataplus._M_p == *(pointer *)((long)&__rhs[1].field_2 + 8)) ||
           (bVar6 = (anonymous_namespace)::
                    contains<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&__rhs[1].field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (cVar7._M_node + 2)), bVar6)) {
          if (*(size_type *)((long)&__rhs[2].field_2 + 8) != __rhs[2].field_2._M_allocated_capacity)
          {
            Layout::name_abi_cxx11_((string *)&shiftedPosition,&this->_layout);
            bVar6 = (anonymous_namespace)::
                    contains<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&__rhs[2].field_2,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &shiftedPosition);
            std::__cxx11::string::~string((string *)&shiftedPosition);
            if (!bVar6) goto LAB_00159f69;
          }
          bVar6 = std::operator!=(&label,__rhs);
          if (!bVar6) {
            value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __rhs[1]._M_dataplus._M_p;
            pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __rhs[1]._M_string_length;
            do {
              if (value == pbVar2) {
                psVar3 = (string *)__rhs[1]._M_string_length;
                for (name = (string *)__rhs[1]._M_dataplus._M_p; name != psVar3;
                    name = (string *)&name[1]._M_string_length) {
                  shiftedPosition._0_8_ = Layout::indexForName(&this->_layout,name);
                  _assert_impl((bool)(shiftedPosition.which_._0_1_ & 1),"mapping channel not found")
                  ;
                  piVar8 = boost::optional<int>::get((optional<int> *)&shiftedPosition);
                  (*direct->_vptr_OutputGains[2])
                            ((int)name[1]._M_dataplus._M_p,direct,(long)*piVar8);
                }
                this_02 = (SpeakerPosition *)&label;
                goto LAB_0015a10e;
              }
              Layout::channelNames_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&shiftedPosition,&this->_layout);
              bVar6 = (anonymous_namespace)::
                      contains<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&shiftedPosition,value);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&shiftedPosition);
              value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &value[1]._M_string_length;
            } while (bVar6);
          }
        }
LAB_00159f69:
      }
      std::__cxx11::string::~string((string *)&label);
    }
  }
  pbVar11 = (metadata->speakerLabels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (metadata->speakerLabels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar11 == pbVar4) {
      _applyScreenEdgeLock(&shiftedPosition,this,&metadata->position);
      index = _findChannelWithinBounds(this,&shiftedPosition,isLfe,1e-05);
      if (((ulong)index.super_type & 1) == 0) {
        if (isLfe) {
          _Var9 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                            ((this->_channelNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->_channelNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,"LFE1");
          if (_Var9._M_current !=
              (this->_channelNames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            (*direct->_vptr_OutputGains[2])
                      (0,direct,(long)(int)((ulong)((long)_Var9._M_current -
                                                   (long)(this->_channelNames).
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
          }
        }
        else {
          boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::variant
                    (&local_100,&shiftedPosition);
          toCartesianVector3d((Vector3d *)&label,&local_100);
          boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::destroy_content
                    (&local_100);
          (**((this->_pointSourcePanner).
              super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_PointSourcePanner)(&local_200);
          other = (DenseStorage<double,__1,__1,_1,_0> *)
                  boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                            ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_200);
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&gains,other);
          boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
          ~optional_base(&local_200);
          local_200._0_8_ = &this->_isLfe;
          mask_write<ear::OutputGains&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
                    (direct,(CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
                             *)&local_200,&gains);
          free(gains.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
        }
      }
      else {
        piVar8 = boost::optional<int>::get(&index);
        (*direct->_vptr_OutputGains[2])(0,direct,(long)*piVar8);
      }
      boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::destroy_content
                (&shiftedPosition);
      return;
    }
    std::__cxx11::string::string((string *)&shiftedPosition,(string *)pbVar11);
    _nominalSpeakerLabel(&label,this,(string *)&shiftedPosition);
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((this->_channelNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->_channelNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&label);
    if (_Var9._M_current !=
        (this->_channelNames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      index_00 = (long)(int)((ulong)((long)_Var9._M_current -
                                    (long)(this->_channelNames).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Array<bool,__1,_1,_0,__1,_1>,_1> *)&this->_isLfe,
                           index_00);
      if (*pSVar10 == isLfe) {
        (*direct->_vptr_OutputGains[2])(0,direct,index_00);
        std::__cxx11::string::~string((string *)&label);
        this_02 = &shiftedPosition;
LAB_0015a10e:
        std::__cxx11::string::~string((string *)this_02);
        return;
      }
    }
    std::__cxx11::string::~string((string *)&label);
    std::__cxx11::string::~string((string *)&shiftedPosition);
    pbVar11 = pbVar11 + 1;
  } while( true );
}

Assistant:

void GainCalculatorDirectSpeakersImpl::calculate(
      const DirectSpeakersTypeMetadata& metadata, OutputGains& direct,
      const WarningCB& warning_cb) {
    if (metadata.audioPackFormatID && metadata.speakerLabels.size() == 0)
      throw adm_error(
          "common definitions audioPackFormatID specified without any "
          "speakerLabels as specified in the common definitions file");
    direct.check_size(_nChannels);

    boost::apply_visitor(throw_if_not_implemented(), metadata.position);

    double tol = 1e-5;
    bool isLfe = _isLfeChannel(metadata, warning_cb);
    direct.zero();

    if (metadata.audioPackFormatID) {
      auto found_pack = itu_packs.find(metadata.audioPackFormatID.get());
      if (found_pack != itu_packs.end()) {
        const std::string& itu_layout_name = found_pack->second;
        std::string label = _nominalSpeakerLabel(metadata.speakerLabels[0]);

        for (const MappingRule& rule : rules) {
          if (rule_applies(rule, itu_layout_name, label, _layout)) {
            for (auto& channel_gain : rule.gains) {
              auto idx = _layout.indexForName(channel_gain.first);
              ear_assert((bool)idx, "mapping channel not found");
              direct.write(idx.get(), channel_gain.second);
            }
            return;
          }
        }
      }
    }

    // try to find a speaker that matches a speakerLabel and type; earlier
    // speakerLabel values have higher priority
    for (std::string speakerLabel : metadata.speakerLabels) {
      std::string nominalLabel = _nominalSpeakerLabel(speakerLabel);
      auto it =
          std::find(_channelNames.begin(), _channelNames.end(), nominalLabel);
      if (it != _channelNames.end()) {
        int index = static_cast<int>(std::distance(_channelNames.begin(), it));
        if (isLfe == _isLfe[index]) {
          direct.write(index, 1.0);
          return;
        }
      }
    }
    // shift the nominal speaker position to the screen edges if specified
    SpeakerPosition shiftedPosition = _applyScreenEdgeLock(metadata.position);

    // otherwise, find the closest speaker with the correct type within the
    // given bounds
    boost::optional<int> index =
        _findChannelWithinBounds(shiftedPosition, isLfe, tol);
    if (index) {
      direct.write(boost::get(index), 1.0);
      return;
    }

    // otherwise, use the point source panner for non-LFE, and handle LFE
    // channels using downmixing rules

    if (isLfe) {
      auto it = std::find(_channelNames.begin(), _channelNames.end(), "LFE1");
      if (it != _channelNames.end()) {
        int index = static_cast<int>(std::distance(_channelNames.begin(), it));
        direct.write(index, 1.0);
      }
      return;
    } else {
      Eigen::Vector3d pos = toCartesianVector3d(shiftedPosition);
      Eigen::VectorXd gains = _pointSourcePanner->handle(pos).get();
      mask_write(direct, !_isLfe, gains);
      return;
    }
  }